

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall
HMatrix::setup_lgBs(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  int iVar10;
  size_type sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  size_type __new_size;
  value_type local_34;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Astart,Astart_,Astart_ + (long)numCol_ + 1);
  __new_size = (size_type)(Astart_ + (long)numCol_ + 1)[-1];
  pvVar1 = &this->Aindex;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)pvVar1,Aindex_,Aindex_ + __new_size);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->Avalue,Avalue_,Avalue_ + __new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1);
  this_00 = &this->AR_Nend;
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,(long)this->numRow,&local_34);
  if (0 < (long)__new_size) {
    piVar3 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      piVar5 = piVar4 + piVar3[sVar11];
      *piVar5 = *piVar5 + 1;
      sVar11 = sVar11 + 1;
    } while (__new_size != sVar11);
  }
  piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar5 = 0;
  if (0 < this->numRow) {
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *piVar5;
    lVar12 = 0;
    do {
      iVar10 = iVar10 + piVar3[lVar12];
      piVar5[lVar12 + 1] = iVar10;
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numRow);
  }
  if (0 < this->numRow) {
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      piVar3[lVar12] = piVar5[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numRow);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,__new_size);
  if (0 < this->numCol) {
    piVar3 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      lVar14 = (long)piVar3[lVar12];
      lVar13 = lVar12 + 1;
      if (piVar3[lVar12] < piVar3[lVar12 + 1]) {
        do {
          iVar10 = piVar4[lVar14];
          iVar2 = piVar6[iVar10];
          piVar6[iVar10] = iVar2 + 1;
          piVar7[iVar2] = (int)lVar12;
          pdVar9[iVar2] = pdVar8[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 < piVar3[lVar13]);
      }
      lVar12 = lVar13;
    } while (lVar13 < this->numCol);
  }
  return;
}

Assistant:

void HMatrix::setup_lgBs(int numCol_, int numRow_, const int *Astart_,
			 const int *Aindex_, const double *Avalue_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a logical basis
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);
  
  // Build row copy - pointers
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  for (int k = 0; k < AcountX; k++)
    AR_Nend[Aindex[k]]++;
  ARstart[0] = 0;
  for (int i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + AR_Nend[i - 1];
  for (int i = 0; i < numRow; i++)
    AR_Nend[i] = ARstart[i];
  
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      int iRow = Aindex[k];
      int iPut = AR_Nend[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}